

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O3

int ffi_callback_set(lua_State *L,GCfunc *fn)

{
  byte bVar1;
  ushort uVar2;
  GCtab *t;
  MSize key;
  uint uVar3;
  TValue *pTVar4;
  ulong uVar5;
  GCobj *o;
  CTState *cts;
  
  pTVar4 = L->base;
  if ((L->top <= pTVar4) || ((pTVar4->field_2).it != 0xfffffff5)) {
    lj_err_argt(L,1,10);
  }
  uVar3 = (pTVar4->u32).lo;
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
  cts->L = L;
  uVar2 = *(ushort *)((ulong)uVar3 + 6);
  if (((((cts->tab[uVar2].info & 0xf0000000) == 0x20000000) && (cts->tab[uVar2].size == 8)) &&
      (key = lj_ccallback_ptr2slot(cts,*(void **)((ulong)uVar3 + 8)), key < (cts->cb).sizeid)) &&
     ((cts->cb).cbid[key] != 0)) {
    t = cts->miscmap;
    if (key < t->asize) {
      pTVar4 = (TValue *)((ulong)(t->array).ptr32 + (long)(int)key * 8);
    }
    else {
      pTVar4 = lj_tab_setinth(L,t,key);
    }
    if (fn == (GCfunc *)0x0) {
      (pTVar4->field_2).it = 0xffffffff;
      (cts->cb).cbid[key] = 0;
      uVar3 = (cts->cb).topid;
      if (key < uVar3) {
        uVar3 = key;
      }
      (cts->cb).topid = uVar3;
    }
    else {
      (pTVar4->u32).lo = (uint32_t)fn;
      (pTVar4->field_2).it = 0xfffffff7;
      bVar1 = t->marked;
      uVar3 = (uint)CONCAT71((int7)((ulong)pTVar4 >> 8),bVar1);
      if ((bVar1 & 4) != 0) {
        uVar5 = (ulong)(L->glref).ptr32;
        t->marked = bVar1 & 0xfb;
        uVar3 = *(uint *)(uVar5 + 0x6c);
        (t->gclist).gcptr32 = uVar3;
        *(int *)(uVar5 + 0x6c) = (int)t;
      }
    }
    return uVar3;
  }
  lj_err_caller(L,LJ_ERR_FFI_BADCBACK);
}

Assistant:

static int ffi_callback_set(lua_State *L, GCfunc *fn)
{
  GCcdata *cd = ffi_checkcdata(L, 1);
  CTState *cts = ctype_cts(L);
  CType *ct = ctype_raw(cts, cd->ctypeid);
  if (ctype_isptr(ct->info) && (LJ_32 || ct->size == 8)) {
    MSize slot = lj_ccallback_ptr2slot(cts, *(void **)cdataptr(cd));
    if (slot < cts->cb.sizeid && cts->cb.cbid[slot] != 0) {
      GCtab *t = cts->miscmap;
      TValue *tv = lj_tab_setint(L, t, (int32_t)slot);
      if (fn) {
	setfuncV(L, tv, fn);
	lj_gc_anybarriert(L, t);
      } else {
	setnilV(tv);
	cts->cb.cbid[slot] = 0;
	cts->cb.topid = slot < cts->cb.topid ? slot : cts->cb.topid;
      }
      return 0;
    }
  }
  lj_err_caller(L, LJ_ERR_FFI_BADCBACK);
  return 0;
}